

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  Iterator iter;
  long local_70;
  long local_68;
  Iterator local_60;
  SearchKey local_48;
  Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *local_40;
  long *local_38;
  char (*local_30) [7];
  
  local_40 = this + 0x20;
  local_70 = *(long *)this;
  local_68 = *(long *)(this + 8) - local_70 >> 4;
  local_38 = &local_70;
  local_48._vptr_SearchKey = (_func_int **)&PTR_search_001b8ac0;
  local_30 = params;
  _::BTreeImpl::search(&local_60,(BTreeImpl *)(this + 0x28),&local_48);
  lVar3 = local_70;
  if (((ulong)local_60.row != 0xe) && (uVar1 = (local_60.leaf)->rows[local_60.row].i, uVar1 != 0)) {
    lVar6 = (ulong)(uVar1 - 1) * 0x10;
    lVar2 = *(long *)(local_70 + 8 + lVar6);
    sVar5 = strlen(*params);
    if ((lVar2 == sVar5 + 1) &&
       (iVar4 = bcmp(*(void **)(lVar3 + lVar6),params,lVar2 - 1), iVar4 == 0)) {
      return (Maybe<kj::StringPtr_&>)(StringPtr *)(lVar6 + *(long *)this);
    }
  }
  return (Maybe<kj::StringPtr_&>)(StringPtr *)0x0;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}